

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.h
# Opt level: O2

int kputsn(char *p,int l,kstring_t *s)

{
  ulong uVar1;
  char *pcVar2;
  size_t __size;
  size_t __n;
  size_t sVar3;
  
  sVar3 = s->l;
  __n = (size_t)l;
  uVar1 = __n + sVar3 + 1;
  if (uVar1 < s->m) {
    pcVar2 = s->s;
  }
  else {
    uVar1 = uVar1 >> 1 | uVar1;
    uVar1 = uVar1 >> 2 | uVar1;
    uVar1 = uVar1 >> 4 | uVar1;
    uVar1 = uVar1 >> 8 | uVar1;
    __size = (uVar1 >> 0x10 | uVar1) + 1;
    s->m = __size;
    pcVar2 = (char *)realloc(s->s,__size);
    if (pcVar2 == (char *)0x0) goto LAB_00141041;
    s->s = pcVar2;
    sVar3 = s->l;
  }
  memcpy(pcVar2 + sVar3,p,__n);
  sVar3 = __n + s->l;
  s->l = sVar3;
  pcVar2 = s->s;
  pcVar2[sVar3] = '\0';
LAB_00141041:
  return (int)pcVar2;
}

Assistant:

static inline int kputsn(const char *p, int l, kstring_t *s)
{
	if (s->l + l + 1 >= s->m) {
		char *tmp;
		s->m = s->l + l + 2;
		kroundup32(s->m);
		if ((tmp = (char*)realloc(s->s, s->m)))
			s->s = tmp;
		else
			return EOF;
	}
	memcpy(s->s + s->l, p, l);
	s->l += l;
	s->s[s->l] = 0;
	return l;
}